

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O3

StaticAssertion * __thiscall
soul::PoolAllocator::
allocate<soul::AST::StaticAssertion,soul::AST::Context_const&,soul::pool_ref<soul::AST::Expression>&,std::__cxx11::string>
          (PoolAllocator *this,Context *args,pool_ref<soul::AST::Expression> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Expression *failureCondition;
  PoolItem *pPVar2;
  string local_48;
  
  pPVar2 = allocateSpaceForObject(this,0x58);
  failureCondition = args_1->object;
  local_48._M_dataplus._M_p = (args_2->_M_dataplus)._M_p;
  paVar1 = &args_2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == paVar1) {
    local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_48.field_2._8_8_ = *(undefined8 *)((long)&args_2->field_2 + 8);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_48._M_string_length = args_2->_M_string_length;
  (args_2->_M_dataplus)._M_p = (pointer)paVar1;
  args_2->_M_string_length = 0;
  (args_2->field_2)._M_local_buf[0] = '\0';
  AST::StaticAssertion::StaticAssertion
            ((StaticAssertion *)&pPVar2->item,args,failureCondition,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pPVar2->destructor =
       allocate<soul::AST::StaticAssertion,_const_soul::AST::Context_&,_soul::pool_ref<soul::AST::Expression>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::anon_class_1_0_00000001::__invoke;
  return (StaticAssertion *)&pPVar2->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }